

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O3

void __thiscall
CNscContext::GetFence
          (CNscContext *this,CNscPStackEntry *pEntry,size_t nFnSymbol,NscFenceType nFenceType,
          bool fEatScope)

{
  NscSymbolFence *pNVar1;
  NscSymbolFence *pNVar2;
  anon_union_8_2_ecfd7102_for_NscSymbolFence_9 aVar3;
  
  pNVar2 = pEntry->m_pFence;
  if (pNVar2 == (NscSymbolFence *)0x0) {
    pNVar2 = (NscSymbolFence *)operator_new(0x238);
    pEntry->m_pFence = pNVar2;
  }
  else if (pNVar2->nFenceType == NscFenceType_Switch) {
    aVar3 = pNVar2->field_9;
    if ((aVar3 != (anon_union_8_2_ecfd7102_for_NscSymbolFence_9)0x0) &&
       (*(void **)aVar3 != (void *)0x0)) {
      operator_delete(*(void **)aVar3);
    }
    operator_delete((void *)aVar3);
    pEntry->m_pFence->field_9 = (anon_union_8_2_ecfd7102_for_NscSymbolFence_9)0x0;
    pNVar2 = pEntry->m_pFence;
  }
  memcpy(pNVar2,&(this->m_sSymbols).m_sFence,0x238);
  pNVar2->nSize = (this->m_sSymbols).m_nSize;
  pNVar2 = pEntry->m_pFence;
  pNVar2->nFnSymbol = nFnSymbol;
  pNVar2->nFenceType = nFenceType;
  pNVar2->fEatScope = fEatScope;
  pNVar1 = this->m_pCurrentFence;
  pNVar2->pNext = pNVar1;
  pNVar2->nLocals = 0;
  pNVar2->nPrevLocals = 0;
  pNVar2->fHasDefault = false;
  pNVar2->nFenceReturn = NscFenceReturn_Unknown;
  if (pNVar1 != (NscSymbolFence *)0x0) {
    pNVar2->nPrevLocals = pNVar1->nPrevLocals + pNVar1->nLocals;
  }
  if (nFenceType == NscFenceType_Switch) {
    aVar3 = (anon_union_8_2_ecfd7102_for_NscSymbolFence_9)operator_new(0x18);
    *(undefined8 *)aVar3 = 0;
    *(undefined8 *)((long)aVar3 + 8) = 0;
    *(undefined8 *)((long)aVar3 + 0x10) = 0;
    pNVar2->field_9 = aVar3;
  }
  else if (nFenceType == NscFenceType_Function) {
    (pNVar2->field_9).field_0.nFunctionLocals = 0;
    (pEntry->m_pFence->field_9).field_0.fWarnedLocalOverflow = false;
  }
  pEntry->m_fFenceValid = true;
  this->m_pCurrentFence = pEntry->m_pFence;
  return;
}

Assistant:

void GetFence (CNscPStackEntry *pEntry, size_t nFnSymbol,
		NscFenceType nFenceType, bool fEatScope)
	{
		if (pEntry ->m_pFence == NULL)
			pEntry ->m_pFence = new NscSymbolFence;
		else
		{
			if (pEntry ->m_pFence ->nFenceType == NscFenceType_Switch)
			{
				delete pEntry ->m_pFence ->pSwitchCasesUsed;
				pEntry ->m_pFence ->pSwitchCasesUsed = NULL;
			}
		}
		m_sSymbols .GetFence (pEntry ->m_pFence);
		pEntry ->m_pFence ->nFnSymbol = nFnSymbol;
		pEntry ->m_pFence ->nFenceType = nFenceType;
		pEntry ->m_pFence ->fEatScope = fEatScope;
		pEntry ->m_pFence ->pNext = m_pCurrentFence;
		pEntry ->m_pFence ->nLocals = 0;
		pEntry ->m_pFence ->nPrevLocals = 0;
		pEntry ->m_pFence ->fHasDefault = false;
		pEntry ->m_pFence ->nFenceReturn = NscFenceReturn_Unknown;
		if (m_pCurrentFence)
		{
			pEntry ->m_pFence ->nPrevLocals += 
				m_pCurrentFence ->nLocals +
				m_pCurrentFence ->nPrevLocals;
		}
		if (nFenceType == NscFenceType_Function)
		{
			pEntry ->m_pFence ->nFunctionLocals = 0;
			pEntry ->m_pFence ->fWarnedLocalOverflow = false;
		}
		else if (nFenceType == NscFenceType_Switch)
		{
			pEntry ->m_pFence ->pSwitchCasesUsed = new CaseValueVec;
		}
		pEntry ->m_fFenceValid = true;
		m_pCurrentFence = pEntry ->m_pFence;
		return;
	}